

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O2

void __thiscall irr::gui::CGUITabControl::scrollRight(CGUITabControl *this)

{
  bool bVar1;
  
  if (this->CurrentScrollTabIndex <
      (int)((ulong)((long)(this->Tabs).m_data.
                          super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->Tabs).m_data.
                         super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1) {
    bVar1 = needScrollControl(this,this->CurrentScrollTabIndex,true,(s32 *)0x0);
    if (bVar1) {
      this->CurrentScrollTabIndex = this->CurrentScrollTabIndex + 1;
    }
  }
  recalculateScrollBar(this);
  return;
}

Assistant:

void CGUITabControl::scrollRight()
{
	if (CurrentScrollTabIndex < (s32)(Tabs.size()) - 1) {
		if (needScrollControl(CurrentScrollTabIndex, true))
			++CurrentScrollTabIndex;
	}
	recalculateScrollBar();
}